

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<std::__cxx11::string,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *default_value)

{
  ulong uVar1;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  undefined2 in_DX;
  long *in_RSI;
  Deserializer *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_R8;
  type *ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff98;
  Deserializer *this_00;
  
  this_00 = in_RDI;
  uVar1 = (**(code **)(*in_RSI + 0x20))(in_RSI,in_DX,CONCAT62(in_register_0000000a,in_CX),in_DX);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RSI + 0x28))(in_RSI,0);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector(in_R8,in_stack_ffffffffffffff98);
  }
  else {
    Read<duckdb::vector<std::__cxx11::string,true>>(this_00);
    (**(code **)(*in_RSI + 0x28))(in_RSI,1);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDI;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}